

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
booster::locale::basic_format<char>::write(basic_format<char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string_type format;
  string_type *in_stack_00000060;
  stream_type *in_stack_00000068;
  basic_format<char> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  locale local_58 [8];
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  locale *in_stack_ffffffffffffffc0;
  basic_message<char> *in_stack_ffffffffffffffc8;
  string local_30 [32];
  long *local_10;
  basic_format<char> *local_8;
  
  local_10 = (long *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  std::__cxx11::string::string(local_30);
  if ((this->translate_ & 1U) == 0) {
    std::__cxx11::string::operator=(local_30,(string *)&this->format_);
  }
  else {
    std::ios_base::getloc((ios_base *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    booster::locale::ios_info::get((ios_base *)((long)local_10 + *(long *)(*local_10 + -0x18)));
    booster::locale::ios_info::domain_id();
    basic_message<char>::str_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    std::__cxx11::string::operator=(local_30,local_50);
    std::__cxx11::string::~string(local_50);
    std::locale::~locale(local_58);
  }
  format_output(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  sVar1 = std::__cxx11::string::~string(local_30);
  return sVar1;
}

Assistant:

void write(stream_type &out) const
            {
                string_type format;
                if(translate_)
                    format = message_.str(out.getloc(),ios_info::get(out).domain_id());
                else
                    format = format_;
               
                format_output(out,format);

            }